

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_impl_opengl2.cpp
# Opt level: O2

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData *draw_data)

{
  undefined4 uVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  ImDrawList *this;
  ImDrawVert *pIVar5;
  ImDrawCallback p_Var6;
  undefined1 auVar7 [16];
  undefined4 in_EAX;
  int iVar8;
  uint uVar9;
  ImDrawCmd *pIVar10;
  long lVar11;
  unsigned_short *puVar12;
  int cmd_i;
  int iVar13;
  float fVar14;
  float fVar16;
  undefined1 auVar15 [16];
  float fVar17;
  float fVar18;
  int fb_width;
  int fb_height;
  float fVar19;
  GLint last_tex_env_mode;
  GLint last_texture;
  GLint last_polygon_mode [2];
  GLint last_scissor_box [4];
  GLint last_viewport [4];
  float local_78;
  float local_68;
  
  fb_width = (int)((draw_data->FramebufferScale).x * (draw_data->DisplaySize).x);
  fb_height = (int)((draw_data->FramebufferScale).y * (draw_data->DisplaySize).y);
  auVar15._0_4_ = -(uint)(fb_width == 0);
  auVar15._4_4_ = -(uint)(fb_width == 0);
  auVar15._8_4_ = -(uint)(fb_height == 0);
  auVar15._12_4_ = -(uint)(fb_height == 0);
  iVar8 = movmskpd(in_EAX,auVar15);
  if (iVar8 == 0) {
    glGetIntegerv(0x8069,&last_texture);
    glGetIntegerv(0xb40,last_polygon_mode);
    glGetIntegerv(0xba2,last_viewport);
    glGetIntegerv(0xc10,last_scissor_box);
    glGetTexEnviv(0x2300,0x2200,&last_tex_env_mode);
    glPushAttrib(0x7000);
    ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
    IVar2 = draw_data->DisplayPos;
    IVar3 = draw_data->FramebufferScale;
    fVar18 = IVar3.y;
    fVar16 = IVar2.y;
    for (lVar11 = 0; lVar11 < draw_data->CmdListsCount; lVar11 = lVar11 + 1) {
      this = draw_data->CmdLists[lVar11];
      puVar12 = (this->IdxBuffer).Data;
      pIVar5 = (this->VtxBuffer).Data;
      glVertexPointer(2,0x1406,0x14,pIVar5);
      glTexCoordPointer(2,0x1406,0x14,&pIVar5->uv);
      glColorPointer(4,0x1401,0x14,&pIVar5->col);
      for (iVar8 = 0; iVar8 < (this->CmdBuffer).Size; iVar8 = iVar8 + 1) {
        pIVar10 = ImVector<ImDrawCmd>::operator[](&this->CmdBuffer,iVar8);
        p_Var6 = pIVar10->UserCallback;
        if (p_Var6 == (ImDrawCallback)0x0) {
          local_68 = IVar2.x;
          local_78 = IVar3.x;
          fVar14 = ((pIVar10->ClipRect).x - local_68) * local_78;
          if ((fVar14 < (float)fb_width) &&
             (fVar17 = ((pIVar10->ClipRect).y - fVar16) * fVar18, fVar17 < (float)fb_height)) {
            uVar1 = (pIVar10->ClipRect).z;
            uVar4 = (pIVar10->ClipRect).w;
            local_78 = ((float)uVar1 - local_68) * local_78;
            fVar19 = ((float)uVar4 - fVar16) * fVar18;
            iVar13 = -(uint)(0.0 <= local_78);
            auVar7._4_4_ = iVar13;
            auVar7._0_4_ = iVar13;
            auVar7._8_4_ = -(uint)(0.0 <= fVar19);
            auVar7._12_4_ = -(uint)(0.0 <= fVar19);
            uVar9 = movmskpd(0,auVar7);
            if (((uVar9 & 1) != 0) && ((byte)((byte)uVar9 >> 1) != 0)) {
              glScissor((int)fVar14,(int)((float)fb_height - fVar19),(int)(local_78 - fVar14),
                        (int)(fVar19 - fVar17));
              glBindTexture(0xde1,*(undefined4 *)&pIVar10->TextureId);
              glDrawElements(4,pIVar10->ElemCount,0x1403,puVar12);
            }
          }
        }
        else if (p_Var6 == (ImDrawCallback)0xffffffffffffffff) {
          ImGui_ImplOpenGL2_SetupRenderState(draw_data,fb_width,fb_height);
        }
        else {
          (*p_Var6)(this,pIVar10);
        }
        puVar12 = puVar12 + pIVar10->ElemCount;
      }
    }
    glDisableClientState(0x8076);
    glDisableClientState(0x8078);
    glDisableClientState(0x8074);
    glBindTexture(0xde1,last_texture);
    glMatrixMode(0x1700);
    glPopMatrix();
    glMatrixMode(0x1701);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(0x404,last_polygon_mode[0]);
    glPolygonMode(0x405,last_polygon_mode[1]);
    glViewport(last_viewport[0],last_viewport[1],last_viewport[2],last_viewport[3]);
    glScissor(last_scissor_box[0],last_scissor_box[1],last_scissor_box[2],last_scissor_box[3]);
    glTexEnvi(0x2300,0x2200,last_tex_env_mode);
  }
  return;
}

Assistant:

void ImGui_ImplOpenGL2_RenderDrawData(ImDrawData* draw_data)
{
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(draw_data->DisplaySize.x * draw_data->FramebufferScale.x);
    int fb_height = (int)(draw_data->DisplaySize.y * draw_data->FramebufferScale.y);
    if (fb_width == 0 || fb_height == 0)
        return;

    // Backup GL state
    GLint last_texture; glGetIntegerv(GL_TEXTURE_BINDING_2D, &last_texture);
    GLint last_polygon_mode[2]; glGetIntegerv(GL_POLYGON_MODE, last_polygon_mode);
    GLint last_viewport[4]; glGetIntegerv(GL_VIEWPORT, last_viewport);
    GLint last_scissor_box[4]; glGetIntegerv(GL_SCISSOR_BOX, last_scissor_box);
    GLint last_tex_env_mode; glGetTexEnviv(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, &last_tex_env_mode);
    glPushAttrib(GL_ENABLE_BIT | GL_COLOR_BUFFER_BIT | GL_TRANSFORM_BIT);

    // Setup desired GL state
    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = draw_data->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = draw_data->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < draw_data->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = draw_data->CmdLists[n];
        const ImDrawVert* vtx_buffer = cmd_list->VtxBuffer.Data;
        const ImDrawIdx* idx_buffer = cmd_list->IdxBuffer.Data;
        glVertexPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, pos)));
        glTexCoordPointer(2, GL_FLOAT, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, uv)));
        glColorPointer(4, GL_UNSIGNED_BYTE, sizeof(ImDrawVert), (const GLvoid*)((const char*)vtx_buffer + IM_OFFSETOF(ImDrawVert, col)));

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            if (pcmd->UserCallback)
            {
                // User callback, registered via ImDrawList::AddCallback()
                // (ImDrawCallback_ResetRenderState is a special callback value used by the user to request the renderer to reset render state.)
                if (pcmd->UserCallback == ImDrawCallback_ResetRenderState)
                    ImGui_ImplOpenGL2_SetupRenderState(draw_data, fb_width, fb_height);
                else
                    pcmd->UserCallback(cmd_list, pcmd);
            }
            else
            {
                // Project scissor/clipping rectangles into framebuffer space
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    // Apply scissor/clipping rectangle
                    glScissor((int)clip_rect.x, (int)(fb_height - clip_rect.w), (int)(clip_rect.z - clip_rect.x), (int)(clip_rect.w - clip_rect.y));

                    // Bind texture, Draw
                    glBindTexture(GL_TEXTURE_2D, (GLuint)(intptr_t)pcmd->TextureId);
                    glDrawElements(GL_TRIANGLES, (GLsizei)pcmd->ElemCount, sizeof(ImDrawIdx) == 2 ? GL_UNSIGNED_SHORT : GL_UNSIGNED_INT, idx_buffer);
                }
            }
            idx_buffer += pcmd->ElemCount;
        }
    }

    // Restore modified GL state
    glDisableClientState(GL_COLOR_ARRAY);
    glDisableClientState(GL_TEXTURE_COORD_ARRAY);
    glDisableClientState(GL_VERTEX_ARRAY);
    glBindTexture(GL_TEXTURE_2D, (GLuint)last_texture);
    glMatrixMode(GL_MODELVIEW);
    glPopMatrix();
    glMatrixMode(GL_PROJECTION);
    glPopMatrix();
    glPopAttrib();
    glPolygonMode(GL_FRONT, (GLenum)last_polygon_mode[0]); glPolygonMode(GL_BACK, (GLenum)last_polygon_mode[1]);
    glViewport(last_viewport[0], last_viewport[1], (GLsizei)last_viewport[2], (GLsizei)last_viewport[3]);
    glScissor(last_scissor_box[0], last_scissor_box[1], (GLsizei)last_scissor_box[2], (GLsizei)last_scissor_box[3]);
    glTexEnvi(GL_TEXTURE_ENV, GL_TEXTURE_ENV_MODE, last_tex_env_mode);
}